

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_parser.c
# Opt level: O0

MPP_RET mpp_mpg4_parser_flush(Mpg4dParser ctx)

{
  int index_00;
  MppBufSlots slots_00;
  RK_S32 index;
  Mpg4Hdr *hdr_ref0;
  MppBufSlots slots;
  Mpg4dParserImpl *p;
  Mpg4dParser ctx_local;
  
  slots_00 = *ctx;
  index_00 = *(int *)((long)ctx + 0x278);
  if ((mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","in\n","mpp_mpg4_parser_flush");
  }
  if ((*(int *)((long)ctx + 0x27c) == 0) && (-1 < index_00)) {
    mpp_buf_slot_set_flag(slots_00,index_00,SLOT_QUEUE_USE);
    mpp_buf_slot_enqueue(slots_00,index_00,QUEUE_DISPLAY);
    *(undefined4 *)((long)ctx + 0x27c) = 1;
  }
  if ((mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","out\n","mpp_mpg4_parser_flush");
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_mpg4_parser_flush(Mpg4dParser ctx)
{
    Mpg4dParserImpl *p = (Mpg4dParserImpl *)ctx;
    MppBufSlots slots = p->frame_slots;
    Mpg4Hdr *hdr_ref0 = &p->hdr_ref0;
    RK_S32 index = hdr_ref0->slot_idx;

    mpg4d_dbg_func("in\n");

    if (!hdr_ref0->enqueued && index >= 0) {
        mpp_buf_slot_set_flag(slots, index, SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(slots, index, QUEUE_DISPLAY);
        hdr_ref0->enqueued = 1;
    }

    mpg4d_dbg_func("out\n");

    return MPP_OK;
}